

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O1

int parse_pmc_id(uint32_t pmc_id,chipset_info *info)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  _Bool *p_Var4;
  uint uVar5;
  long lVar6;
  
  *(undefined8 *)&info->gpu = 0;
  info->gpu_desc = (gpu *)0x0;
  info->pmc_id = 0;
  info->chipset = 0;
  info->card_type = 0;
  info->endian = 0;
  info->gpu = GPU_UNKNOWN;
  info->gpu_desc = (gpu *)0x0;
  if ((pmc_id & 0xf80) != 0x80 && (int)pmc_id < 0) {
    info->endian = 1;
    pmc_id = pmc_id >> 0x18 | (pmc_id & 0xff0000) >> 8 | (pmc_id & 0xff00) << 8 | pmc_id << 0x18;
  }
  info->pmc_id = pmc_id;
  iVar1 = -1;
  if (-1 < (int)pmc_id || (pmc_id & 0xf00) == 0) {
    if ((char)pmc_id < '\0') {
      uVar2 = pmc_id >> 0x14 & 0x1ff;
      info->chipset = uVar2;
      uVar5 = pmc_id >> 0x14 & 0x1f0;
      info->card_type = uVar5;
      iVar3 = 0x40;
      if (((uVar5 == 0x60) || (iVar3 = 0x50, uVar5 - 0x80 < 0x21)) ||
         (iVar3 = 0xc0, uVar5 - 0xc0 < 0x41)) {
        info->card_type = iVar3;
      }
      p_Var4 = &gpu_list[0].id_valid;
      lVar6 = 0;
      do {
        if ((*p_Var4 == true) && (*(uint32_t *)(p_Var4 + -4) == uVar2)) {
          info->gpu = (gpu_index)lVar6;
        }
        lVar6 = lVar6 + 1;
        p_Var4 = p_Var4 + 0x40;
      } while (lVar6 != 0x5c);
    }
    else if ((pmc_id & 0xf000) == 0) {
      uVar2 = pmc_id >> 0x10 & 0xf;
      info->chipset = uVar2;
      info->card_type = uVar2;
      if (uVar2 == 3) {
        if ((pmc_id & 0x60) == 0) {
          info->gpu = GPU_NV3;
        }
        else {
          info->gpu = GPU_NV3T;
        }
      }
      else if (uVar2 == 1) {
        info->gpu = GPU_NV1;
      }
    }
    else {
      uVar2 = (uint)((pmc_id & 0xf00000) == 0);
      info->chipset = uVar2 ^ 5;
      info->gpu = GPU_NV5 - uVar2;
      info->card_type = 4;
    }
    if ((ulong)info->gpu != 0x5c) {
      info->gpu_desc = gpu_list + info->gpu;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int parse_pmc_id(uint32_t pmc_id, struct chipset_info *info) {
	/* First, detect PMC_ID format and endianness */
	memset(info, 0, sizeof *info);
	info->endian = 0;
	info->gpu = GPU_UNKNOWN;
	info->gpu_desc = 0;
	if (pmc_id_flipped(pmc_id)) {
		/* bit 31 set - set endian flag and byteswap */
		info->endian = 1;
		pmc_id = (pmc_id & 0x0000ffff) << 16 | (pmc_id & 0xffff0000) >> 16;
		pmc_id = (pmc_id & 0x00ff00ff) << 8 | (pmc_id & 0xff00ff00) >> 8;
	}
	info->pmc_id = pmc_id;
	if (pmc_id & 0x80000000 && pmc_id & 0x00000F00) {
		/* bit 31 still set - ie. old bit 7 was set, and bits 8-11 are
		 * still nonzero - BAR0 is broken */
		return -1;
	}
	if (pmc_id & 0x80) {
		/* NV10+ */
		info->chipset = pmc_id >> 20 & 0x1ff;
		info->card_type = info->chipset & 0x1f0;
		if (info->card_type == 0x60) {
			info->card_type = 0x40;
		} else if (info->card_type >= 0x80 && info->card_type <= 0xa0) {
			info->card_type = 0x50;
		} else if (info->card_type >= 0xc0 && info->card_type <= 0x100) {
			info->card_type = 0xc0;
		}
		for (int i = 0; i < NUM_GPU; i++) {
			if (gpu_list[i].id_valid && gpu_list[i].id == info->chipset) {
				info->gpu = i;
			}
		}
	} else {
		/* pre-NV10 */
		if (pmc_id & 0xf000) {
			if (pmc_id & 0xf00000) {
				info->chipset = 5;
				info->gpu = GPU_NV5;
			} else {
				info->chipset = 4;
				info->gpu = GPU_NV4;
			}
			info->card_type = 4;
		} else {
			info->chipset = pmc_id >> 16 & 0xf;
			info->card_type = info->chipset;
			if (info->chipset == 1) {
				info->gpu = GPU_NV1;
			} else if (info->chipset == 3) {
				if ((pmc_id & 0xff) >= 0x20) {
					info->gpu = GPU_NV3T;
				} else {
					info->gpu = GPU_NV3;
				}
			}
		}
	}
	if (info->gpu != GPU_UNKNOWN) {
		info->gpu_desc = &gpu_list[info->gpu];
		return 0;
	} else {
		return -1;
	}
}